

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::ErrorErrorCategory::message_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int condition)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if (condition == 2) {
    pcVar2 = 
    "Inconvertible error value. An error has occurred that could not be converted to a known std::error_code. Please file a bug."
    ;
    paVar1 = &local_a;
  }
  else {
    if (condition != 1) {
      llvm::llvm_unreachable_internal
                ("Unhandled error code",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Error.cpp"
                 ,0x29);
    }
    pcVar2 = "Multiple errors";
    paVar1 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int condition) const override {
      switch (static_cast<ErrorErrorCode>(condition)) {
      case ErrorErrorCode::MultipleErrors:
        return "Multiple errors";
      case ErrorErrorCode::InconvertibleError:
        return "Inconvertible error value. An error has occurred that could "
               "not be converted to a known std::error_code. Please file a "
               "bug.";
      }
      llvm_unreachable("Unhandled error code");
    }